

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O0

void test_2d_static<5ul,1ul,30ul,1ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  size_type sVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  size_type sVar8;
  long lVar9;
  bool bVar10;
  int local_19c [2];
  dimensions<5UL,_1UL> local_193 [2];
  dimensions<5UL,_1UL> local_191;
  size_type local_190;
  unsigned_long local_188;
  value_type true_idx_2;
  int local_178;
  int i_2;
  int j_2;
  int *local_168;
  size_type local_160;
  unsigned_long local_158;
  size_t true_idx_1;
  int iStack_148;
  dimensions<5UL,_1UL> s;
  int i_1;
  int j_1;
  int *local_138;
  size_type local_130;
  unsigned_long local_128;
  value_type true_idx;
  int i;
  int j;
  int dptr [30];
  unsigned_long local_98;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  unsigned_long local_78;
  size_type local_70;
  unsigned_long local_68;
  size_type local_60;
  bool local_55;
  bool local_54;
  layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  local_53;
  unsigned_long uStack_50;
  layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  sub_l;
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb7,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_18,&local_1c
            );
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xba,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_28,&local_2c
            );
  local_38 = std::experimental::dimensions<30UL,_1UL>::size((dimensions<30UL,_1UL> *)local_b);
  local_40 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_38,&local_40
            );
  local_48 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::span(local_b);
  uStack_50 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbd,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_48,
             &stack0xffffffffffffffb0);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right(&local_53);
  local_54 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::is_regular();
  local_55 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc3,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_54,&local_55
            );
  local_60 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(&local_53,0);
  local_68 = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_60,&local_68
            );
  local_70 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(&local_53,1);
  local_78 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc6,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_70,&local_78
            );
  local_80 = std::experimental::dimensions<6UL,_1UL>::size((dimensions<6UL,_1UL> *)&local_53);
  local_88 = 6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,200,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_80,&local_88)
  ;
  local_90 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::span(&local_53);
  local_98 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc9,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_90,&local_98
            );
  true_idx._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)true_idx._4_4_;
    vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                      ((dimensions<30UL,_1UL> *)local_b,1);
    if (vVar2 <= uVar1) break;
    true_idx._0_4_ = 0;
    while( true ) {
      uVar1 = (ulong)(int)true_idx;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_b,0);
      if (vVar2 <= uVar1) break;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_b,1);
      local_128 = vVar2 * (long)(int)true_idx + (long)true_idx._4_4_;
      local_130 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd3,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_130,
                 &local_128);
      sVar3 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_138 = &i + sVar3;
      _j_1 = &i + local_128;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd5,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_138,
                 (int **)&j_1);
      sVar3 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      (&i)[sVar3] = 0x2a;
      sVar3 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      i_1 = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd9,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar3,&i_1
                );
      true_idx._0_4_ = (int)true_idx + 1;
    }
    true_idx._4_4_ = true_idx._4_4_ + 1;
  }
  iStack_148 = 0;
  while( true ) {
    uVar1 = (ulong)iStack_148;
    vVar4 = std::experimental::dimensions<6UL,_1UL>::operator[]<int>
                      ((dimensions<6UL,_1UL> *)&local_53,1);
    if (vVar4 <= uVar1) break;
    true_idx_1._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_1._4_4_;
      vVar4 = std::experimental::dimensions<6UL,_1UL>::operator[]<int>
                        ((dimensions<6UL,_1UL> *)&local_53,0);
      if (vVar4 <= uVar1) break;
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::stepping(&local_53);
      vVar4 = std::experimental::dimensions<6UL,_1UL>::operator[]<int>
                        ((dimensions<6UL,_1UL> *)&local_53,1);
      vVar5 = std::experimental::dimensions<5UL,_1UL>::operator[]<int>
                        ((dimensions<5UL,_1UL> *)((long)&true_idx_1 + 3),1);
      vVar6 = std::experimental::dimensions<5UL,_1UL>::operator[]<int>
                        ((dimensions<5UL,_1UL> *)((long)&true_idx_1 + 3),0);
      lVar9 = (long)true_idx_1._4_4_;
      vVar7 = std::experimental::dimensions<5UL,_1UL>::operator[]<int>
                        ((dimensions<5UL,_1UL> *)((long)&true_idx_1 + 3),1);
      local_158 = vVar4 * vVar5 * vVar6 * lVar9 + vVar7 * (long)iStack_148;
      local_160 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)&local_53,true_idx_1._4_4_,iStack_148);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe3,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_160,
                 &local_158);
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)&local_53,true_idx_1._4_4_,iStack_148);
      local_168 = &i + sVar8;
      _j_2 = &i + local_158;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe5,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_168,
                 (int **)&j_2);
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)&local_53,true_idx_1._4_4_,iStack_148);
      (&i)[sVar8] = 0x11;
      sVar8 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<6ul,1ul>,std::experimental::dimensions<5ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)&local_53,true_idx_1._4_4_,iStack_148);
      i_2 = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe9,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar8,&i_2
                );
      true_idx_1._4_4_ = true_idx_1._4_4_ + 1;
    }
    iStack_148 = iStack_148 + 1;
  }
  local_178 = 0;
  while( true ) {
    uVar1 = (ulong)local_178;
    vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                      ((dimensions<30UL,_1UL> *)local_b,1);
    if (vVar2 <= uVar1) break;
    true_idx_2._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_2._4_4_;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_b,0);
      if (vVar2 <= uVar1) break;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_b,1);
      local_188 = vVar2 * (long)true_idx_2._4_4_ + (long)local_178;
      local_190 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,true_idx_2._4_4_,local_178);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf2,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_190,
                 &local_188);
      uVar1 = (ulong)true_idx_2._4_4_;
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::stepping(&local_53);
      vVar5 = std::experimental::dimensions<5UL,_1UL>::operator[]<int>(&local_191,0);
      bVar10 = false;
      if (uVar1 % vVar5 == 0) {
        uVar1 = (ulong)local_178;
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<6UL,_1UL>,_std::experimental::dimensions<5UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
        ::stepping(&local_53);
        vVar5 = std::experimental::dimensions<5UL,_1UL>::operator[]<int>(local_193,1);
        bVar10 = uVar1 % vVar5 == 0;
      }
      if (bVar10) {
        sVar3 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_b,true_idx_2._4_4_,local_178);
        local_19c[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                   ,0xf9,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar3,
                   local_19c + 1);
      }
      else {
        sVar3 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_b,true_idx_2._4_4_,local_178);
        local_19c[0] = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                   ,0xfe,"void test_2d_static() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar3,
                   local_19c);
      }
      true_idx_2._4_4_ = true_idx_2._4_4_ + 1;
    }
    local_178 = local_178 + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}